

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O2

Aig_Obj_t * Bmc_ObjChild0Frames(Aig_Obj_t *pObj,int i)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  
  if (((ulong)pObj & 1) == 0) {
    pAVar1 = pObj->pFanin0;
    pAVar2 = (Aig_Obj_t *)((ulong)pAVar1 & 0xfffffffffffffffe);
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      pAVar2 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = Bmc_ObjFrames(pAVar2,i);
      pAVar2 = (Aig_Obj_t *)((ulong)((uint)pAVar1 & 1) ^ (ulong)pAVar2);
    }
    return pAVar2;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraBmc.c"
                ,0x36,"Aig_Obj_t *Bmc_ObjChild0Frames(Aig_Obj_t *, int)");
}

Assistant:

static inline Aig_Obj_t *  Bmc_ObjChild0Frames( Aig_Obj_t * pObj, int i ) { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin0(pObj)? Aig_NotCond(Bmc_ObjFrames(Aig_ObjFanin0(pObj),i), Aig_ObjFaninC0(pObj)) : NULL;  }